

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O0

void emit_loadu64(ASMState *as,Reg r,uint64_t u64)

{
  MCode *pMVar1;
  int iVar2;
  int32_t i;
  MCode *p_1;
  MCode *p;
  uint64_t u64_local;
  Reg r_local;
  ASMState *as_local;
  uint32_t rex;
  int n;
  
  i = (int32_t)u64;
  if (u64 == (u64 & 0xffffffff)) {
    emit_loadi(as,r,i);
  }
  else if (u64 == (long)i) {
    pMVar1 = as->mcp;
    *(int32_t *)(pMVar1 + -4) = i;
    pMVar1[-5] = ((byte)r & 7) - 0x40;
    pMVar1[-9] = 0xfe;
    pMVar1[-8] = '\0';
    pMVar1[-7] = '\0';
    pMVar1[-6] = 199;
    _n = pMVar1 + -6;
    iVar2 = (r >> 3 & 1) + 0x140;
    if (iVar2 != 0x40) {
      _n = pMVar1 + -7;
      pMVar1[-7] = (byte)iVar2 | 8;
    }
    as->mcp = _n;
  }
  else if (u64 - (long)&as->J[1].L == (long)(i - ((int)as->J + 0xca8))) {
    emit_rmro(as,XO_LEA,r | 0x80200,0xe,i - ((int)as->J + 0xca8));
  }
  else if ((u64 - (long)as->mcp == (long)(i - (int)as->mcp)) &&
          (u64 - (long)as->mctop == (long)(i - (int)as->mctop))) {
    emit_rmro(as,XO_LEA,r | 0x80200,0x25,i - (int)as->mcp);
  }
  else {
    pMVar1 = as->mcp;
    *(uint64_t *)(pMVar1 + -8) = u64;
    pMVar1[-9] = ((byte)r & 7) + 0xb8;
    pMVar1[-10] = ((byte)(r >> 3) & 1) + 0x48;
    as->mcp = pMVar1 + -10;
  }
  return;
}

Assistant:

static void emit_loadu64(ASMState *as, Reg r, uint64_t u64)
{
  if (checku32(u64)) {  /* 32 bit load clears upper 32 bits. */
    emit_loadi(as, r, (int32_t)u64);
  } else if (checki32((int64_t)u64)) {  /* Sign-extended 32 bit load. */
    MCode *p = as->mcp;
    *(int32_t *)(p-4) = (int32_t)u64;
    as->mcp = emit_opm(XO_MOVmi, XM_REG, REX_64, r, p, -4);
#if LJ_GC64
  } else if (checki32(dispofs(as, u64))) {
    emit_rmro(as, XO_LEA, r|REX_64, RID_DISPATCH, (int32_t)dispofs(as, u64));
  } else if (checki32(mcpofs(as, u64)) && checki32(mctopofs(as, u64))) {
    /* Since as->realign assumes the code size doesn't change, check
    ** RIP-relative addressing reachability for both as->mcp and as->mctop.
    */
    emit_rmro(as, XO_LEA, r|REX_64, RID_RIP, (int32_t)mcpofs(as, u64));
#endif
  } else {  /* Full-size 64 bit load. */
    MCode *p = as->mcp;
    *(uint64_t *)(p-8) = u64;
    p[-9] = (MCode)(XI_MOVri+(r&7));
    p[-10] = 0x48 + ((r>>3)&1);
    p -= 10;
    as->mcp = p;
  }
}